

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawIndexed
          (VulkanCommandBuffer *this,uint32_t IndexCount,uint32_t InstanceCount,uint32_t FirstIndex,
          int32_t VertexOffset,uint32_t FirstInstance)

{
  undefined4 in_register_0000000c;
  string msg;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,FirstIndex));
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (((this->m_State).RenderPass == (VkRenderPass)0x0) &&
     ((this->m_State).DynamicRenderingHash == 0)) {
    Diligent::FormatString<char[154]>
              (&msg,(char (*) [154])
                    "vkCmdDrawIndexed() must be called inside render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexed-renderpass)"
              );
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x81);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>(&msg,(char (*) [27])"No graphics pipeline bound");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x82);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_State).IndexBuffer == (VkBuffer)0x0) {
    Diligent::FormatString<char[22]>(&msg,(char (*) [22])"No index buffer bound");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x83);
    std::__cxx11::string::~string((string *)&msg);
  }
  (*vkCmdDrawIndexed)(this->m_VkCmdBuffer,IndexCount,InstanceCount,FirstIndex,VertexOffset,
                      FirstInstance);
  return;
}

Assistant:

__forceinline void DrawIndexed(uint32_t IndexCount, uint32_t InstanceCount, uint32_t FirstIndex, int32_t VertexOffset, uint32_t FirstInstance)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(),
               "vkCmdDrawIndexed() must be called inside render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexed-renderpass)");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");
        VERIFY(m_State.IndexBuffer != VK_NULL_HANDLE, "No index buffer bound");

        vkCmdDrawIndexed(m_VkCmdBuffer, IndexCount, InstanceCount, FirstIndex, VertexOffset, FirstInstance);
    }